

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Parameter::~Parameter(Parameter *this)

{
  Parameter *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map(&this->json_double_value);
  std::vector<double,_std::allocator<double>_>::~vector(&this->number_array);
  std::__cxx11::string::~string((string *)&this->string_value);
  return;
}

Assistant:

Parameter() = default;